

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeIntArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  uint index;
  ulong uVar9;
  byte *buffer_00;
  int local_34 [2];
  int32 value;
  
  uVar1 = *(uint *)buffer;
  uVar6 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar6 <= (ulong)uVar1 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12a4,
                                "(serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength()"
                               );
    if (!bVar5) goto LAB_007c702d;
    *puVar7 = 0;
  }
  pbVar8 = ByteBlock::GetBuffer(deserializeInto);
  uVar1 = *(uint *)buffer;
  uVar2 = *(uint *)(buffer + 5);
  *(uint *)(pbVar8 + uVar1) = uVar2;
  uVar3 = *(uint *)buffer;
  uVar6 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar6 < (ulong)uVar3 + (ulong)uVar2 * 4 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12a8,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar5) {
LAB_007c702d:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  buffer_00 = buffer + 9;
  for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
    buffer_00 = ReadConstantSizedInt32(this,buffer_00,local_34);
    *(int *)(pbVar8 + uVar9 * 4 + (ulong)uVar1 + 4) = local_34[0];
  }
  return buffer_00;
}

Assistant:

const byte * DeserializeIntArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const Js::SerializedIntArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxIntArray);
#endif
        Assert(serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength());
        auto result = (AuxArray<int> *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->intCount;
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            int32 value;
            current = ReadConstantSizedInt32(current, &value);
            result->elements[index] = value;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxIntArray);
#endif
        return current;
    }